

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O3

pair<optional<Text>,_bool> * __thiscall
Patch::compute_old_text
          (pair<optional<Text>,_bool> *__return_storage_ptr__,Patch *this,
          optional<Text> *deleted_text,Point new_splice_start,Point new_deletion_end)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  TextSlice slice;
  TextSlice slice_00;
  TextSlice slice_01;
  bool bVar2;
  Point PVar3;
  Point *this_00;
  pointer pCVar4;
  Point deleted_text_slice_start;
  TextSlice deleted_text_slice;
  vector<Patch::Change,_std::allocator<Patch::Change>_> overlapping_changes;
  Text result;
  pair<TextSlice,_TextSlice> split_result;
  undefined1 local_130 [32];
  pointer local_110;
  pointer puStack_108;
  pointer local_100;
  undefined1 local_f8;
  Point local_f0;
  TextSlice local_e8;
  vector<Patch::Change,_std::allocator<Patch::Change>_> local_d0;
  Point local_b8;
  Text local_b0;
  pair<TextSlice,_TextSlice> local_78;
  TextSlice local_48;
  
  if (deleted_text->is_some == false) {
    Text::Text((Text *)local_130);
    paVar1 = &(__return_storage_ptr__->first).value.content.field_2;
    (__return_storage_ptr__->first).value.content._M_dataplus._M_p = (pointer)paVar1;
    if ((Text *)local_130._0_8_ == (Text *)(local_130 + 0x10)) {
      paVar1->_M_allocated_capacity = CONCAT62(local_130._18_6_,local_130._16_2_);
      *(undefined8 *)((long)&(__return_storage_ptr__->first).value.content.field_2 + 8) =
           local_130._24_8_;
    }
    else {
      (__return_storage_ptr__->first).value.content._M_dataplus._M_p = (pointer)local_130._0_8_;
      (__return_storage_ptr__->first).value.content.field_2._M_allocated_capacity =
           CONCAT62(local_130._18_6_,local_130._16_2_);
    }
    (__return_storage_ptr__->first).value.content._M_string_length = local_130._8_8_;
    (__return_storage_ptr__->first).value.line_offsets.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_110;
    (__return_storage_ptr__->first).value.line_offsets.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puStack_108;
    (__return_storage_ptr__->first).value.line_offsets.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_100;
    (__return_storage_ptr__->first).is_some = false;
    __return_storage_ptr__->second = true;
  }
  else {
    Text::Text(&local_b0);
    grab_changes_in_range<Patch::NewCoordinates>
              (&local_d0,this,new_splice_start,new_deletion_end,this->merges_adjacent_changes);
    TextSlice::TextSlice(&local_e8,&deleted_text->value);
    local_f0 = new_splice_start;
    if (local_d0.super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d0.super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_00 = &(local_d0.super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>._M_impl
                  .super__Vector_impl_data._M_start)->new_start;
      do {
        if (this_00[2] == (Point)0x0) {
          Text::Text((Text *)local_130);
          local_f8 = 0;
          paVar1 = &(__return_storage_ptr__->first).value.content.field_2;
          (__return_storage_ptr__->first).value.content._M_dataplus._M_p = (pointer)paVar1;
          if ((Text *)local_130._0_8_ == (Text *)(local_130 + 0x10)) {
            paVar1->_M_allocated_capacity = CONCAT62(local_130._18_6_,local_130._16_2_);
            *(undefined8 *)((long)&(__return_storage_ptr__->first).value.content.field_2 + 8) =
                 local_130._24_8_;
          }
          else {
            (__return_storage_ptr__->first).value.content._M_dataplus._M_p =
                 (pointer)local_130._0_8_;
            (__return_storage_ptr__->first).value.content.field_2._M_allocated_capacity =
                 CONCAT62(local_130._18_6_,local_130._16_2_);
          }
          (__return_storage_ptr__->first).value.content._M_string_length = local_130._8_8_;
          local_130._8_4_ = 0;
          local_130._12_4_ = 0;
          local_130._16_2_ = L'\0';
          (__return_storage_ptr__->first).value.line_offsets.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = local_110;
          (__return_storage_ptr__->first).value.line_offsets.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puStack_108;
          (__return_storage_ptr__->first).value.line_offsets.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_100;
          (__return_storage_ptr__->first).is_some = false;
          local_130._0_8_ = (Text *)(local_130 + 0x10);
          goto LAB_00167d9a;
        }
        bVar2 = Point::operator>(this_00,&local_f0);
        if (bVar2) {
          PVar3 = Point::traversal(this_00,&local_f0);
          TextSlice::split(&local_78,&local_e8,PVar3);
          bVar2 = TextSlice::is_valid(&local_78.first);
          if (bVar2) {
            local_f0 = *this_00;
            local_e8.text = local_78.second.text;
            local_e8.start_position = local_78.second.start_position;
            local_e8.end_position = local_78.second.end_position;
            slice.start_position = local_78.first.start_position;
            slice.text = local_78.first.text;
            slice.end_position = local_78.first.end_position;
            Text::append(&local_b0,slice);
            goto LAB_00167b55;
          }
          Text::Text((Text *)local_130);
LAB_00167cf9:
          local_f8 = 0;
          paVar1 = &(__return_storage_ptr__->first).value.content.field_2;
          (__return_storage_ptr__->first).value.content._M_dataplus._M_p = (pointer)paVar1;
          if ((Text *)local_130._0_8_ == (Text *)(local_130 + 0x10)) {
            paVar1->_M_allocated_capacity = CONCAT62(local_130._18_6_,local_130._16_2_);
            *(undefined8 *)((long)&(__return_storage_ptr__->first).value.content.field_2 + 8) =
                 local_130._24_8_;
          }
          else {
            (__return_storage_ptr__->first).value.content._M_dataplus._M_p =
                 (pointer)local_130._0_8_;
            (__return_storage_ptr__->first).value.content.field_2._M_allocated_capacity =
                 CONCAT62(local_130._18_6_,local_130._16_2_);
          }
          (__return_storage_ptr__->first).value.content._M_string_length = local_130._8_8_;
          local_130._8_4_ = 0;
          local_130._12_4_ = 0;
          local_130._16_2_ = L'\0';
          (__return_storage_ptr__->first).value.line_offsets.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = local_110;
          (__return_storage_ptr__->first).value.line_offsets.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puStack_108;
          (__return_storage_ptr__->first).value.line_offsets.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_100;
          (__return_storage_ptr__->first).is_some = false;
          __return_storage_ptr__->second = false;
          local_130._0_8_ = (Text *)(local_130 + 0x10);
          goto LAB_00167d9e;
        }
LAB_00167b55:
        TextSlice::TextSlice(&local_48,(Text *)this_00[2]);
        slice_00.start_position = local_48.start_position;
        slice_00.text = local_48.text;
        slice_00.end_position = local_48.end_position;
        Text::append(&local_b0,slice_00);
        local_78.first.text = (Text *)TextSlice::extent(&local_e8);
        local_b8 = Point::traversal(this_00 + 1,&local_f0);
        PVar3 = Point::min((Point *)&local_78,&local_b8);
        TextSlice::suffix((TextSlice *)local_130,&local_e8,PVar3);
        local_e8.end_position._2_6_ = local_130._18_6_;
        local_e8.end_position.row._0_2_ = local_130._16_2_;
        local_e8.text = (Text *)local_130._0_8_;
        local_e8.start_position.row = local_130._8_4_;
        local_e8.start_position.column = local_130._12_4_;
        local_f0 = this_00[1];
        bVar2 = TextSlice::is_valid(&local_e8);
        if (!bVar2) {
          Text::Text((Text *)local_130);
          goto LAB_00167cf9;
        }
        pCVar4 = (pointer)(this_00 + 6);
        this_00 = this_00 + 8;
      } while (pCVar4 != local_d0.super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    slice_01.start_position = local_e8.start_position;
    slice_01.text = local_e8.text;
    slice_01.end_position = local_e8.end_position;
    Text::append(&local_b0,slice_01);
    optional<Text>::optional(&__return_storage_ptr__->first,&local_b0);
LAB_00167d9a:
    __return_storage_ptr__->second = true;
LAB_00167d9e:
    if (local_d0.super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.
                            super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.
                            super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.line_offsets.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.line_offsets.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.line_offsets.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_b0.content._M_dataplus._M_p != &local_b0.content.field_2) {
      operator_delete(local_b0.content._M_dataplus._M_p,
                      local_b0.content.field_2._M_allocated_capacity * 2 + 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<optional<Text>, bool> Patch::compute_old_text(
  optional<Text> &&deleted_text, Point new_splice_start, Point new_deletion_end
) {
  if (!deleted_text) return {optional<Text>{}, true};

  Text result;

  auto overlapping_changes = grab_changes_in_range<NewCoordinates>(
    new_splice_start,
    new_deletion_end,
    merges_adjacent_changes
  );

  TextSlice deleted_text_slice = TextSlice(*deleted_text);
  Point deleted_text_slice_start = new_splice_start;

  for (const Change &change : overlapping_changes) {
    if (!change.old_text) return {optional<Text>{}, true};

    if (change.new_start > deleted_text_slice_start) {
      auto split_result = deleted_text_slice.split(
        change.new_start.traversal(deleted_text_slice_start)
      );
      if (!split_result.first.is_valid()) return {optional<Text>{}, false};
      deleted_text_slice_start = change.new_start;
      deleted_text_slice = split_result.second;
      result.append(split_result.first);
    }

    result.append(*change.old_text);
    deleted_text_slice = deleted_text_slice.suffix(Point::min(
      deleted_text_slice.extent(),
      change.new_end.traversal(deleted_text_slice_start)
    ));
    deleted_text_slice_start = change.new_end;

    if (!deleted_text_slice.is_valid()) return {optional<Text>{}, false};
  }

  result.append(deleted_text_slice);
  return {result, true};
}